

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::moveAppend
          (QGenericArrayOps<EnumNameValue> *this,EnumNameValue *b,EnumNameValue *e)

{
  qsizetype *pqVar1;
  EnumNameValue *pEVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pEVar2 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<EnumNameValue>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pEVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pEVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pEVar2[lVar3].name.d.size = qVar6;
      pDVar4 = (b->valueStr).d.d;
      (b->valueStr).d.d = (Data *)0x0;
      pEVar2[lVar3].valueStr.d.d = pDVar4;
      pcVar5 = (b->valueStr).d.ptr;
      (b->valueStr).d.ptr = (char16_t *)0x0;
      pEVar2[lVar3].valueStr.d.ptr = pcVar5;
      qVar6 = (b->valueStr).d.size;
      (b->valueStr).d.size = 0;
      pEVar2[lVar3].valueStr.d.size = qVar6;
      pEVar2[lVar3].value = b->value;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }